

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O3

int macro_subst_tok(TokenString *tok_str,Sym **nested_list,Sym *s)

{
  uint8_t uVar1;
  uint v;
  void *p;
  undefined8 uVar2;
  undefined4 uVar3;
  int iVar4;
  undefined8 uVar5;
  TinyAlloc **ppTVar6;
  Sym *extraout_RAX;
  Sym *pSVar7;
  tm *ptVar8;
  Sym *pSVar9;
  int *piVar10;
  uint *p_00;
  uint *puVar11;
  CValue *pCVar12;
  char *pcVar13;
  uint *puVar14;
  uint uVar15;
  undefined1 p_01 [8];
  uint uVar16;
  char *fmt;
  int iVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  bool bVar22;
  time_t local_130;
  time_t ti;
  uint *puStack_120;
  undefined8 local_118;
  undefined1 auStack_e8 [8];
  char buf [32];
  CValue local_a8;
  undefined1 auStack_98 [8];
  CValue cval;
  Sym *local_78;
  Sym *args;
  TokenString *local_68;
  void *local_60;
  uint *local_58;
  Sym *local_50;
  CValue local_48;
  uint local_34;
  
  iVar19 = parse_flags;
  if (tok == 0x14d) {
    uVar15 = pp_counter;
    pp_counter = pp_counter + 1;
LAB_0012364e:
    pcVar13 = auStack_e8;
    snprintf(pcVar13,0x20,"%d",(ulong)uVar15);
    iVar19 = 0xbe;
LAB_00123671:
    ti = 0;
    puStack_120 = (uint *)0x0;
    local_118._0_4_ = 0;
    local_118._4_4_ = 0;
    cstr_cat((CString *)&ti,pcVar13,0);
    p_00 = puStack_120;
    auStack_98._0_4_ = (undefined4)ti;
    cval.d = (double)puStack_120;
    tok_str_add2(tok_str,iVar19,(CValue *)auStack_98);
    ppTVar6 = &cstr_alloc;
  }
  else {
    if (tok == 0x148) {
      pcVar13 = file->filename;
LAB_00123637:
      iVar19 = 0xb9;
      goto LAB_00123671;
    }
    if (tok == 0x147) {
      uVar15 = file->line_num;
      goto LAB_0012364e;
    }
    if (tok - 0x149U < 2) {
      time(&local_130);
      ptVar8 = localtime(&local_130);
      if (tok == 0x149) {
        pcVar13 = auStack_e8;
        snprintf(pcVar13,0x20,"%s %2d %d",ab_month_name + ptVar8->tm_mon,
                 (ulong)(uint)ptVar8->tm_mday,(ulong)(ptVar8->tm_year + 0x76c));
      }
      else {
        pcVar13 = auStack_e8;
        snprintf(pcVar13,0x20,"%02d:%02d:%02d",(ulong)(uint)ptVar8->tm_hour,
                 (ulong)(uint)ptVar8->tm_min,(ulong)(uint)ptVar8->tm_sec);
      }
      goto LAB_00123637;
    }
    p_00 = (uint *)(s->field_3).d;
    pSVar7 = (Sym *)(ulong)(tok - 0x149U);
    if (p_00 == (uint *)0x0) goto LAB_001236c5;
    local_60 = (void *)CONCAT44(local_60._4_4_,parse_flags);
    args = (Sym *)nested_list;
    local_68 = tok_str;
    local_50 = s;
    if ((s->type).t == 1) {
      auStack_e8 = (undefined1  [8])0x0;
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      buf[4] = '\0';
      buf[5] = '\0';
      buf[6] = '\0';
      buf[7] = '\0';
      buf[8] = '\0';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = -1;
      buf[0xd] = -1;
      buf[0xe] = -1;
      buf[0xf] = -1;
      parse_flags = parse_flags | 0x34;
      local_34 = next_argstream(nested_list,(TokenString *)auStack_e8);
      local_58 = p_00;
      if (local_34 == 0x28) {
        tal_free_impl(tokstr_alloc,(void *)auStack_e8);
        do {
          next_nomacro_spc();
          if (0xff < (long)tok) break;
        } while (tok == 0xcb || (isidnum_table[(long)tok + 1] & 1) != 0);
        local_78 = (Sym *)0x0;
        pSVar7 = (local_50->field_5).next;
LAB_00123808:
        do {
          do {
            next_argstream(nested_list,(TokenString *)0x0);
          } while (tok == 10);
        } while (((uint)tok < 0x21 & (byte)(0x100003a00 >> ((byte)tok & 0x3f))) != 0);
        bVar22 = tok == 0x29;
        do {
          if ((bool)((local_78 == (Sym *)0x0 && pSVar7 == (Sym *)0x0) & bVar22)) {
            pSVar9 = (Sym *)0x0;
LAB_00123b43:
            parse_flags = (int)local_60;
            p_00 = (uint *)macro_arg_subst(nested_list,(int *)local_58,pSVar9);
            pSVar7 = local_78;
            while (pSVar7 != (Sym *)0x0) {
              pSVar9 = pSVar7->prev;
              tal_free_impl(tokstr_alloc,(pSVar7->field_3).d);
              if ((pSVar7->field_5).next != (Sym *)0x0) {
                tal_free_impl(tokstr_alloc,(((pSVar7->field_5).next)->field_3).d);
                sym_free((pSVar7->field_5).next);
              }
              sym_free(pSVar7);
              pSVar7 = pSVar9;
            }
            goto LAB_00123ba6;
          }
          if (pSVar7 == (Sym *)0x0) {
            pcVar13 = get_tok_str(local_50->v,(CValue *)0x0);
            fmt = "macro \'%s\' used with too many args";
            goto LAB_00124186;
          }
          ti = 0;
          puStack_120 = (uint *)0x0;
          local_118._0_4_ = 0;
          local_118._4_4_ = -1;
          iVar19 = 0;
          iVar17 = 0;
LAB_0012386b:
          if (0 < iVar17) {
LAB_00123881:
            if (tok + 1U < 2) goto LAB_00123914;
            if (tok == 10) {
              tok = 0x20;
              iVar21 = 0x20;
              goto LAB_001238d4;
            }
            if (tok == 0x29) {
              iVar17 = iVar17 + -1;
              iVar21 = 0x29;
              goto LAB_001238d4;
            }
            if (tok == 0x28) {
              iVar17 = iVar17 + 1;
              iVar21 = 0x28;
              goto LAB_001238d4;
            }
            iVar21 = tok;
            if (tok < 0x100) goto LAB_001238d4;
LAB_001238e5:
            iVar19 = 0;
LAB_001238f2:
            tok_str_add2((TokenString *)&ti,iVar21,&tokc);
LAB_00123905:
            next_argstream(nested_list,(TokenString *)0x0);
            goto LAB_0012386b;
          }
          if (tok == 0x2c) {
            iVar21 = 0x2c;
            if ((pSVar7->type).t == 0) goto LAB_00123914;
LAB_001238d4:
            if ((isidnum_table[(long)iVar21 + 1] & 1) == 0) goto LAB_001238e5;
            if (iVar19 == 0) {
              iVar19 = 1;
              goto LAB_001238f2;
            }
            goto LAB_00123905;
          }
          if (tok != 0x29) goto LAB_00123881;
LAB_00123914:
          if (iVar17 != 0) {
            expect(")");
          }
          lVar18 = (long)(int)puStack_120;
          iVar21 = (int)(lVar18 - iVar19);
          iVar17 = (int)local_118;
          if ((int)local_118 <= iVar21) {
            iVar4 = (int)local_118;
            if ((int)local_118 < 0x11) {
              iVar4 = 0x10;
            }
            do {
              iVar17 = iVar4;
              iVar4 = iVar17 * 2;
            } while (iVar17 <= iVar21);
            ti = (time_t)tal_realloc_impl(&tokstr_alloc,(void *)ti,iVar17 * 4);
            local_118._0_4_ = iVar17;
          }
          *(undefined4 *)(ti + (lVar18 - iVar19) * 4) = 0xffffffff;
          if (iVar17 <= iVar21 + 1) {
            if (iVar17 < 0x11) {
              iVar17 = 0x10;
            }
            do {
              iVar19 = iVar17;
              iVar17 = iVar19 * 2;
            } while (iVar19 < iVar21 + 2);
            ti = (time_t)tal_realloc_impl(&tokstr_alloc,(void *)ti,iVar19 * 4);
            local_118._0_4_ = iVar19;
          }
          *(undefined4 *)(ti + (long)(iVar21 + 1) * 4) = 0;
          puStack_120 = (uint *)CONCAT44(puStack_120._4_4_,iVar21 + 2);
          pSVar9 = sym_push2(&local_78,pSVar7->v & 0xdfffffff,(pSVar7->type).t,0);
          (pSVar9->field_3).enum_val = ti;
          pSVar7 = (pSVar7->field_5).next;
          nested_list = (Sym **)args;
          tok_str = local_68;
          if (tok != 0x29) goto LAB_00123a5a;
          pSVar9 = local_78;
          if (pSVar7 == (Sym *)0x0) goto LAB_00123b43;
          if (((pSVar7->type).t == 0) || (bVar22 = true, gnu_ext == 0)) {
            pcVar13 = get_tok_str(local_50->v,(CValue *)0x0);
            fmt = "macro \'%s\' used with too few args";
LAB_00124186:
            tcc_error(fmt,pcVar13);
          }
        } while( true );
      }
      parse_flags = iVar19;
      tok_str_add(tok_str,tok);
      if (((parse_flags & 0x10U) != 0) && (0 < (int)buf._0_4_)) {
        lVar18 = 0;
        iVar19 = tok_str->len;
        do {
          uVar15 = *(uint *)((long)auStack_e8 + lVar18 * 4);
          if (iVar19 < tok_str->allocated_len) {
            piVar10 = tok_str->str;
          }
          else {
            piVar10 = tok_str_realloc(tok_str,iVar19 + 1);
          }
          piVar10[iVar19] = uVar15;
          tok_str->len = iVar19 + 1;
          lVar18 = lVar18 + 1;
          iVar19 = iVar19 + 1;
        } while (lVar18 < (int)buf._0_4_);
      }
      tal_free_impl(tokstr_alloc,(void *)auStack_e8);
      nested_list = (Sym **)args;
      p_00 = local_58;
LAB_00123ba6:
      pSVar7 = (Sym *)(ulong)local_34;
      if (local_34 != 0x28) goto LAB_001236c5;
    }
    sym_push2(nested_list,local_50->v,0,0);
    parse_flags = (int)local_60;
    puVar14 = p_00;
    do {
      puVar11 = puVar14 + 1;
      uVar15 = *puVar14;
      switch(uVar15) {
      case 0xb3:
      case 0xb4:
      case 0xb5:
      case 0xc0:
        local_48.d = (double)(long)(int)puVar14[1];
        goto LAB_00123c1b;
      case 0xb6:
        local_48.d = (double)(ulong)puVar14[1];
LAB_00123c1b:
        puVar14 = puVar14 + 2;
        break;
      case 0xb7:
      case 0xb8:
      case 0xbc:
      case 0xce:
      case 0xcf:
        iVar19 = 2;
        goto LAB_00123bf9;
      case 0xb9:
      case 0xba:
      case 0xbe:
      case 0xbf:
        local_48.str.data = puVar14 + 2;
        local_48.f = (float)puVar14[1];
        puVar14 = (uint *)((long)puVar14 + ((long)(int)puVar14[1] + 3U & 0xfffffffffffffffc) + 8);
        break;
      case 0xbb:
        puVar11 = puVar14 + 1;
        puVar14 = puVar14 + 2;
        local_48.f = (float)*puVar11;
        break;
      case 0xbd:
        iVar19 = 4;
LAB_00123bf9:
        lVar18 = 0;
        do {
          *(undefined4 *)((long)&local_48 + lVar18) = *(undefined4 *)((long)puVar11 + lVar18);
          lVar18 = lVar18 + 4;
        } while (iVar19 << 2 != (int)lVar18);
        puVar11 = (uint *)((long)puVar11 + lVar18);
switchD_00123bf2_caseD_c1:
        puVar14 = puVar11;
        break;
      default:
        goto switchD_00123bf2_caseD_c1;
      }
      if (uVar15 == 0) {
        p_01 = (undefined1  [8])0x0;
        goto LAB_001240fc;
      }
    } while (uVar15 != 0xcd);
    auStack_e8 = (undefined1  [8])0x0;
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = -1;
    buf[0xd] = -1;
    buf[0xe] = -1;
    buf[0xf] = -1;
    uVar15 = 0xffffffff;
    puVar14 = p_00;
    local_58 = p_00;
LAB_00123c9b:
    do {
      tok_str = local_68;
      nested_list = (Sym **)args;
      puVar11 = p_00 + 1;
      v = *p_00;
      switch(v) {
      case 0xb3:
      case 0xb4:
      case 0xb5:
      case 0xc0:
        local_48.d = (double)(long)(int)p_00[1];
        p_00 = p_00 + 2;
        break;
      case 0xb6:
        local_48.d = (double)(ulong)p_00[1];
        p_00 = p_00 + 2;
        goto LAB_00123d1b;
      case 0xb7:
      case 0xb8:
      case 0xbc:
      case 0xce:
      case 0xcf:
        iVar19 = 2;
        goto LAB_00123cbe;
      case 0xb9:
      case 0xba:
      case 0xbe:
      case 0xbf:
        local_48.str.data = p_00 + 2;
        local_48.f = (float)p_00[1];
        p_00 = (uint *)((long)p_00 + ((long)(int)p_00[1] + 3U & 0xfffffffffffffffc) + 8);
        break;
      case 0xbb:
        puVar11 = p_00 + 1;
        p_00 = p_00 + 2;
        local_48.f = (float)*puVar11;
        goto LAB_00123d1b;
      case 0xbd:
        iVar19 = 4;
LAB_00123cbe:
        lVar18 = 0;
        do {
          *(undefined4 *)((long)&local_48 + lVar18) = *(undefined4 *)((long)puVar11 + lVar18);
          lVar18 = lVar18 + 4;
        } while (iVar19 << 2 != (int)lVar18);
        puVar11 = (uint *)((long)puVar11 + lVar18);
switchD_00123cb7_caseD_c1:
        p_00 = puVar11;
        break;
      default:
        goto switchD_00123cb7_caseD_c1;
      }
    } while (v == 0xcd);
    if (v != 0) {
LAB_00123d1b:
      uVar20 = *p_00;
      uVar16 = uVar15;
      uVar2 = buf._0_8_;
      uVar5 = local_a8.d;
      while (buf._0_8_ = uVar2, local_a8.i = uVar5, uVar20 == 0xcd) {
        if (-1 < (int)uVar15) {
          buf._4_4_ = SUB84(uVar2,4);
          buf[0] = (char)uVar15;
          buf[1] = (char)(uVar15 >> 8);
          buf[2] = (char)(uVar15 >> 0x10);
          buf[3] = (char)(uVar15 >> 0x18);
        }
        puVar11 = p_00 + 2;
        do {
          p_00 = puVar11;
          uVar20 = p_00[-1];
          puVar11 = p_00 + 1;
        } while (uVar20 == 0xcc);
        local_34 = uVar16;
        if ((uVar20 == 0) || (uVar20 == 0xcd)) {
          p_00 = p_00 + -1;
          uVar16 = v;
          goto LAB_00123f97;
        }
        local_a8.tab[1] = (int)((ulong)uVar5 >> 0x20);
        switch(uVar20) {
        case 0xb3:
        case 0xb4:
        case 0xb5:
        case 0xc0:
          local_a8.d = (double)(long)(int)*p_00;
          p_00 = puVar11;
          break;
        case 0xb6:
          local_a8.d = (double)(ulong)*p_00;
          p_00 = puVar11;
          break;
        case 0xb7:
        case 0xb8:
        case 0xbc:
        case 0xce:
        case 0xcf:
          iVar19 = 2;
          goto LAB_00123d90;
        case 0xb9:
        case 0xba:
        case 0xbe:
        case 0xbf:
          local_a8.str.size = *p_00;
          p_00 = (uint *)(((long)(int)*p_00 + 3U & 0xfffffffffffffffc) + (long)puVar11);
          local_a8.str.data = puVar11;
          break;
        case 0xbb:
          local_a8.str.size = *p_00;
          p_00 = puVar11;
          break;
        case 0xbd:
          iVar19 = 4;
LAB_00123d90:
          lVar18 = 0;
          do {
            uVar16 = *p_00;
            p_00 = p_00 + 1;
            *(uint *)((long)&local_a8 + lVar18 * 4) = uVar16;
            lVar18 = lVar18 + 1;
            uVar5 = local_a8.i;
          } while (iVar19 != (int)lVar18);
switchD_00123d89_caseD_c1:
          local_a8.i = uVar5;
          if ((v != 0xcb) || (uVar16 = 0xcb, uVar20 != 0xcb)) break;
          goto LAB_00123f97;
        default:
          goto switchD_00123d89_caseD_c1;
        }
        auStack_98 = (undefined1  [8])0x0;
        cval.d = 0.0;
        cval.str.data = (void *)0x0;
        iVar19 = 0;
        if (v != 0xcb) {
          pcVar13 = get_tok_str(v,&local_48);
          cstr_cat((CString *)auStack_98,pcVar13,-1);
          iVar19 = auStack_98._0_4_;
        }
        iVar17 = iVar19;
        if (uVar20 != 0xcb) {
          pcVar13 = get_tok_str(uVar20,&local_a8);
          cstr_cat((CString *)auStack_98,pcVar13,-1);
          iVar17 = auStack_98._0_4_;
        }
        if (cval.tab[2] <= iVar17) {
          uVar3 = cval.tab[2];
          if (cval.tab[2] < 9) {
            uVar3 = 8;
          }
          do {
            uVar15 = uVar3;
            uVar3 = uVar15 * 2;
          } while ((int)uVar15 <= iVar17);
          cval.d = (double)tal_realloc_impl(&cstr_alloc,cval.d,uVar15);
          cval.tab[2] = uVar15;
        }
        uVar2 = cval.d;
        iVar21 = iVar17 + 1;
        *(undefined1 *)(cval.i + (long)iVar17) = 0;
        auStack_98._0_4_ = iVar21;
        tcc_open_bf(tcc_state,":paste:",iVar21);
        local_60 = (void *)uVar2;
        memcpy(file->buffer,(void *)uVar2,(long)iVar21);
        tok_flags = 0;
        next_nomacro1();
        puVar14 = local_58;
        uVar1 = *file->buf_ptr;
        p = local_60;
        while (local_60 = p, uVar1 != '\0') {
          if ((0x20 < (ulong)(uint)tok) || ((0x100003a00U >> ((ulong)(uint)tok & 0x3f) & 1) == 0)) {
            tcc_warning("pasting \"%.*s\" and \"%s\" does not give a valid preprocessing token",
                        (long)iVar19,p,(long)p + (long)iVar19);
            tcc_close();
            tal_free_impl(cstr_alloc,p);
            tok_str_add2((TokenString *)auStack_e8,v,&local_48);
            pCVar12 = &local_a8;
            goto LAB_00123f8a;
          }
          next_nomacro1();
          p = local_60;
          uVar1 = *file->buf_ptr;
        }
        tcc_close();
        tal_free_impl(cstr_alloc,local_60);
        pCVar12 = &tokc;
        uVar20 = tok;
LAB_00123f8a:
        local_48.d = (double)pCVar12->i;
        local_48.str.data = (void *)(&pCVar12->d)[1];
        uVar15 = local_34;
        uVar16 = uVar20;
LAB_00123f97:
        v = uVar16;
        uVar16 = local_34;
        uVar2 = buf._0_8_;
        uVar5 = local_a8.i;
        uVar20 = *p_00;
      }
      buf._0_4_ = uVar15;
      if ((int)uVar15 < 0) {
        buf._0_4_ = (undefined4)uVar2;
      }
      uVar15 = buf._0_4_;
      if (v != 0xcc) {
        uVar15 = 0xffffffff;
      }
      tok_str_add2((TokenString *)auStack_e8,v,&local_48);
      goto LAB_00123c9b;
    }
    lVar18 = (long)(int)buf._0_4_;
    if ((int)buf._8_4_ <= (int)buf._0_4_) {
      iVar19 = 0x10;
      if (0x10 < (int)buf._8_4_) {
        iVar19 = buf._8_4_;
      }
      do {
        iVar17 = iVar19;
        iVar19 = iVar17 * 2;
      } while (iVar17 <= (int)buf._0_4_);
      auStack_e8 = (undefined1  [8])tal_realloc_impl(&tokstr_alloc,(void *)auStack_e8,iVar17 * 4);
      buf[8] = (char)iVar17;
      buf[9] = (char)((uint)iVar17 >> 8);
      buf[10] = (char)((uint)iVar17 >> 0x10);
      buf[0xb] = (char)((uint)iVar17 >> 0x18);
      puVar14 = local_58;
    }
    *(uint *)((long)auStack_e8 + lVar18 * 4) = 0;
    p_01 = auStack_e8;
    p_00 = puVar14;
LAB_001240fc:
    puVar14 = (uint *)p_01;
    if (p_01 == (undefined1  [8])0x0) {
      puVar14 = p_00;
    }
    macro_subst(tok_str,nested_list,(int *)puVar14);
    pSVar7 = *nested_list;
    *nested_list = pSVar7->prev;
    sym_free(pSVar7);
    if (p_01 != (undefined1  [8])0x0) {
      tal_free_impl(tokstr_alloc,(void *)p_01);
    }
    pSVar7 = local_50;
    if (p_00 == (uint *)(local_50->field_3).enum_val) goto LAB_001236c5;
    ppTVar6 = &tokstr_alloc;
  }
  tal_free_impl(*ppTVar6,p_00);
  pSVar7 = extraout_RAX;
LAB_001236c5:
  return (int)pSVar7;
LAB_00123a5a:
  if (tok != 0x2c) {
    expect(",");
  }
  goto LAB_00123808;
}

Assistant:

static int macro_subst_tok(TokenString* tok_str, Sym** nested_list, Sym* s) {
  Sym *args, *sa, *sa1;
  int parlevel, t, t1, spc;
  TokenString str;
  char* cstrval;
  CValue cval;
  CString cstr;
  char buf[32];

  /* if symbol is a macro, prepare substitution */
  /* special macros */
  if (tok == TOK___LINE__ || tok == TOK___COUNTER__) {
    t = tok == TOK___LINE__ ? file->line_num : pp_counter++;
    snprintf(buf, sizeof(buf), "%d", t);
    cstrval = buf;
    t1 = TOK_PPNUM;
    goto add_cstr1;
  } else if (tok == TOK___FILE__) {
    cstrval = file->filename;
    goto add_cstr;
  } else if (tok == TOK___DATE__ || tok == TOK___TIME__) {
    time_t ti;
    struct tm* tm;

    time(&ti);
    tm = localtime(&ti);
    if (tok == TOK___DATE__) {
      snprintf(buf, sizeof(buf), "%s %2d %d", ab_month_name[tm->tm_mon], tm->tm_mday, tm->tm_year + 1900);
    } else {
      snprintf(buf, sizeof(buf), "%02d:%02d:%02d", tm->tm_hour, tm->tm_min, tm->tm_sec);
    }
    cstrval = buf;
  add_cstr:
    t1 = TOK_STR;
  add_cstr1:
    cstr_new(&cstr);
    cstr_cat(&cstr, cstrval, 0);
    cval.str.size = cstr.size;
    cval.str.data = cstr.data;
    tok_str_add2(tok_str, t1, &cval);
    cstr_free(&cstr);
  } else if (s->d) {
    int saved_parse_flags = parse_flags;
    int* joined_str = NULL;
    int* mstr = s->d;

    if (s->type.t == MACRO_FUNC) {
      /* whitespace between macro name and argument list */
      TokenString ws_str;
      tok_str_new(&ws_str);

      spc = 0;
      parse_flags |= PARSE_FLAG_SPACES | PARSE_FLAG_LINEFEED | PARSE_FLAG_ACCEPT_STRAYS;

      /* get next token from argument stream */
      t = next_argstream(nested_list, &ws_str);
      if (t != '(') {
        /* not a macro substitution after all, restore the
         * macro token plus all whitespace we've read.
         * whitespace is intentionally not merged to preserve
         * newlines. */
        parse_flags = saved_parse_flags;
        tok_str_add(tok_str, tok);
        if (parse_flags & PARSE_FLAG_SPACES) {
          int i;
          for (i = 0; i < ws_str.len; i++)
            tok_str_add(tok_str, ws_str.str[i]);
        }
        tok_str_free_str(ws_str.str);
        return 0;
      } else {
        tok_str_free_str(ws_str.str);
      }
      do {
        next_nomacro(); /* eat '(' */
      } while (tok == TOK_PLCHLDR);

      /* argument macro */
      args = NULL;
      sa = s->next;
      /* NOTE: empty args are allowed, except if no args */
      for (;;) {
        do {
          next_argstream(nested_list, NULL);
        } while (is_space(tok) || TOK_LINEFEED == tok);
      empty_arg:
        /* handle '()' case */
        if (!args && !sa && tok == ')')
          break;
        if (!sa)
          tcc_error("macro '%s' used with too many args", get_tok_str(s->v, 0));
        tok_str_new(&str);
        parlevel = spc = 0;
        /* NOTE: non zero sa->t indicates VA_ARGS */
        while ((parlevel > 0 || (tok != ')' && (tok != ',' || sa->type.t)))) {
          if (tok == TOK_EOF || tok == 0)
            break;
          if (tok == '(')
            parlevel++;
          else if (tok == ')')
            parlevel--;
          if (tok == TOK_LINEFEED)
            tok = ' ';
          if (!check_space(tok, &spc))
            tok_str_add2(&str, tok, &tokc);
          next_argstream(nested_list, NULL);
        }
        if (parlevel)
          expect(")");
        str.len -= spc;
        tok_str_add(&str, -1);
        tok_str_add(&str, 0);
        sa1 = sym_push2(&args, sa->v & ~SYM_FIELD, sa->type.t, 0);
        sa1->d = str.str;
        sa = sa->next;
        if (tok == ')') {
          /* special case for gcc var args: add an empty
             var arg argument if it is omitted */
          if (sa && sa->type.t && gnu_ext)
            goto empty_arg;
          break;
        }
        if (tok != ',')
          expect(",");
      }
      if (sa) {
        tcc_error("macro '%s' used with too few args", get_tok_str(s->v, 0));
      }

      parse_flags = saved_parse_flags;

      /* now subst each arg */
      mstr = macro_arg_subst(nested_list, mstr, args);
      /* free memory */
      sa = args;
      while (sa) {
        sa1 = sa->prev;
        tok_str_free_str(sa->d);
        if (sa->next) {
          tok_str_free_str(sa->next->d);
          sym_free(sa->next);
        }
        sym_free(sa);
        sa = sa1;
      }
    }

    sym_push2(nested_list, s->v, 0, 0);
    parse_flags = saved_parse_flags;
    joined_str = macro_twosharps(mstr);
    macro_subst(tok_str, nested_list, joined_str ? joined_str : mstr);

    /* pop nested defined symbol */
    sa1 = *nested_list;
    *nested_list = sa1->prev;
    sym_free(sa1);
    if (joined_str)
      tok_str_free_str(joined_str);
    if (mstr != s->d)
      tok_str_free_str(mstr);
  }
  return 0;
}